

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

void __thiscall
CDBIterator::Seek<dbwrapper_tests::StringContentsSerializer>
          (CDBIterator *this,StringContentsSerializer *key)

{
  long lVar1;
  Span<const_std::byte> key_00;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  DataStream ssKey;
  DataStream *in_stack_ffffffffffffff88;
  DataStream *in_stack_ffffffffffffff90;
  CDBIterator *in_stack_ffffffffffffffa8;
  DataStream *pDVar2;
  size_t in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = in_RDI;
  DataStream::DataStream(in_stack_ffffffffffffff88);
  DataStream::reserve(in_stack_ffffffffffffff88,0x5b3b25);
  DataStream::operator<<(in_RDI,(StringContentsSerializer *)in_stack_ffffffffffffff90);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)in_RDI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  key_00.m_size = in_stack_ffffffffffffffc8;
  key_00.m_data = (byte *)pDVar2;
  SeekImpl(in_stack_ffffffffffffffa8,key_00);
  DataStream::~DataStream(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Seek(const K& key) {
        DataStream ssKey{};
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey << key;
        SeekImpl(ssKey);
    }